

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeRestoreCursorPosition(BtCursor *pCur)

{
  uint in_EAX;
  int iVar1;
  int iVar2;
  int skipNext;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  if (pCur->eState == '\x04') {
    return pCur->skipNext;
  }
  pCur->eState = '\x01';
  if (sqlite3Config.xTestCallback != (_func_int_int *)0x0) {
    iVar1 = (*sqlite3Config.xTestCallback)(0x19a);
    iVar2 = 10;
    if (iVar1 != 0) goto LAB_00150af5;
  }
  iVar2 = btreeMoveto(pCur,pCur->pKey,pCur->nKey,0,(int *)((long)&uStack_18 + 4));
LAB_00150af5:
  if (iVar2 == 0) {
    sqlite3_free(pCur->pKey);
    pCur->pKey = (void *)0x0;
    if (uStack_18._4_4_ != 0) {
      pCur->skipNext = uStack_18._4_4_;
    }
    if ((pCur->skipNext != 0) && (pCur->eState == '\0')) {
      pCur->eState = '\x02';
    }
  }
  return iVar2;
}

Assistant:

static int btreeRestoreCursorPosition(BtCursor *pCur){
  int rc;
  int skipNext = 0;
  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState>=CURSOR_REQUIRESEEK );
  if( pCur->eState==CURSOR_FAULT ){
    return pCur->skipNext;
  }
  pCur->eState = CURSOR_INVALID;
  if( sqlite3FaultSim(410) ){
    rc = SQLITE_IOERR;
  }else{
    rc = btreeMoveto(pCur, pCur->pKey, pCur->nKey, 0, &skipNext);
  }
  if( rc==SQLITE_OK ){
    sqlite3_free(pCur->pKey);
    pCur->pKey = 0;
    assert( pCur->eState==CURSOR_VALID || pCur->eState==CURSOR_INVALID );
    if( skipNext ) pCur->skipNext = skipNext;
    if( pCur->skipNext && pCur->eState==CURSOR_VALID ){
      pCur->eState = CURSOR_SKIPNEXT;
    }
  }
  return rc;
}